

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
ConvertToES5ArrayType
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar2;
  
  pEVar2 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
           ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                     ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                       *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return pEVar2;
}

Assistant:

ES5ArrayTypeHandlerBase<TPropertyIndex>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToES5ArrayType(DynamicObject* instance)
    {
        ES5ArrayTypeHandlerBase<TPropertyIndex>* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandlerBase<TPropertyIndex>, const PropertyRecord*>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleDictionaryToDictionaryCount++;
#endif
        return newTypeHandler;
    }